

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::setDecimalSeparatorAlwaysShown(DecimalFormat *this,UBool newValue)

{
  DecimalFormatProperties *pDVar1;
  UErrorCode localStatus;
  undefined8 uStack_8;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->decimalSeparatorAlwaysShown != (bool)newValue) {
    pDVar1->decimalSeparatorAlwaysShown = newValue != '\0';
    uStack_8 = (ulong)pDVar1 & 0xffffffff;
    touch(this,(UErrorCode *)((long)&uStack_8 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setDecimalSeparatorAlwaysShown(UBool newValue) {
    if (UBOOL_TO_BOOL(newValue) == fields->properties->decimalSeparatorAlwaysShown) { return; }
    fields->properties->decimalSeparatorAlwaysShown = newValue;
    touchNoError();
}